

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::WeakFulfiller<kj::Promise<int>_>_>::dispose
          (Own<kj::_::WeakFulfiller<kj::Promise<int>_>_> *this)

{
  WeakFulfiller<kj::Promise<int>_> *object;
  WeakFulfiller<kj::Promise<int>_> *ptrCopy;
  Own<kj::_::WeakFulfiller<kj::Promise<int>_>_> *this_local;
  
  object = this->ptr;
  if (object != (WeakFulfiller<kj::Promise<int>_> *)0x0) {
    this->ptr = (WeakFulfiller<kj::Promise<int>_> *)0x0;
    Disposer::dispose<kj::_::WeakFulfiller<kj::Promise<int>>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }